

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_decompressSequences
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  BYTE *pBVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  BYTE *prefixStart;
  undefined8 uVar8;
  seq_t sequence;
  ulong uVar9;
  U32 i;
  size_t sVar10;
  long lVar11;
  byte bVar12;
  byte bVar13;
  BYTE *pBVar14;
  uint uVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  int iVar18;
  BYTE *__dest;
  BYTE *oend;
  BYTE *pBVar19;
  ulong uVar20;
  BYTE *op;
  ulong uVar21;
  ulong uVar22;
  ulong __n;
  BYTE *litPtr;
  BYTE *local_120;
  BIT_DStream_t local_118;
  ZSTD_fseState local_f0;
  ZSTD_fseState local_e0;
  ZSTD_fseState local_d0;
  ulong local_c0 [6];
  BYTE *local_90;
  BYTE *local_88;
  BYTE *local_80;
  BYTE *local_78;
  ZSTD_DCtx *local_70;
  BYTE *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  size_t sStack_48;
  ulong uStack_40;
  BYTE *pBStack_38;
  
  if (dctx->bmi2 != 0) {
    sVar10 = ZSTD_decompressSequences_bmi2(dctx,dst,maxDstSize,seqStart,seqSize,nbSeq,isLongOffset);
    return sVar10;
  }
  oend = (BYTE *)(maxDstSize + (long)dst);
  local_120 = dctx->litPtr;
  pBVar19 = local_120 + dctx->litSize;
  op = (BYTE *)dst;
  if (nbSeq == 0) {
LAB_0016718d:
    uVar20 = (long)pBVar19 - (long)local_120;
    pBVar19 = (BYTE *)0xffffffffffffffba;
    if (uVar20 <= (ulong)((long)oend - (long)op)) {
      memcpy(op,local_120,uVar20);
      pBVar19 = op + (uVar20 - (long)dst);
    }
  }
  else {
    prefixStart = (BYTE *)dctx->prefixStart;
    local_80 = (BYTE *)dctx->virtualStart;
    local_88 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar11 = -0xc;
    do {
      *(ulong *)((long)local_c0 + lVar11 * 2 + 0x18) =
           (ulong)*(uint *)((long)dctx->workspace + lVar11);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0);
    if (seqSize != 0) {
      local_118.limitPtr = (char *)((long)seqStart + 8);
      if (seqSize < 8) {
        local_118.bitContainer = (size_t)*seqStart;
        switch(seqSize) {
        case 7:
          local_118.bitContainer =
               local_118.bitContainer | (ulong)*(byte *)((long)seqStart + 6) << 0x30;
        case 6:
          local_118.bitContainer =
               local_118.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
        case 5:
          local_118.bitContainer =
               local_118.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
        case 4:
          local_118.bitContainer =
               local_118.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
        case 3:
          local_118.bitContainer =
               local_118.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
        case 2:
          local_118.bitContainer =
               (ulong)*(byte *)((long)seqStart + 1) * 0x100 + local_118.bitContainer;
        }
        bVar2 = *(byte *)((long)seqStart + (seqSize - 1));
        if (bVar2 != 0) {
          uVar15 = 0x1f;
          if (bVar2 != 0) {
            for (; bVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
            }
          }
          local_118.bitsConsumed = (uVar15 ^ 0x1f) + (int)seqSize * -8 + 0x29;
          local_118.ptr = (char *)seqStart;
LAB_00166a11:
          local_118.start = (char *)seqStart;
          local_90 = (BYTE *)dst;
          ZSTD_initFseState(&local_f0,&local_118,dctx->LLTptr);
          ZSTD_initFseState(&local_e0,&local_118,dctx->OFTptr);
          local_70 = dctx;
          ZSTD_initFseState(&local_d0,&local_118,dctx->MLTptr);
          local_68 = oend + -0x20;
          uVar20 = 0;
          op = local_90;
          do {
            uVar9 = local_c0[1];
            uVar7 = local_f0.table[local_f0.state].nextState;
            bVar2 = local_f0.table[local_f0.state].nbAdditionalBits;
            bVar3 = local_f0.table[local_f0.state].nbBits;
            uVar21 = (ulong)local_f0.table[local_f0.state].baseValue;
            local_58 = (ulong)local_d0.table[local_d0.state].nextState;
            bVar13 = local_d0.table[local_d0.state].nbAdditionalBits;
            bVar4 = local_d0.table[local_d0.state].nbBits;
            __n = (ulong)local_d0.table[local_d0.state].baseValue;
            bVar5 = local_e0.table[local_e0.state].nbAdditionalBits;
            bVar6 = local_e0.table[local_e0.state].nbBits;
            local_60 = (ulong)local_e0.table[local_e0.state].nextState;
            bVar12 = (byte)local_118.bitsConsumed;
            if (bVar5 < 2) {
              if (bVar5 != 0) {
                local_118.bitsConsumed = local_118.bitsConsumed + 1;
                lVar11 = (ulong)(local_e0.table[local_e0.state].baseValue + (uint)(uVar21 == 0)) -
                         ((long)(local_118.bitContainer << (bVar12 & 0x3f)) >> 0x3f);
                if (lVar11 == 3) {
                  uVar22 = (local_c0[0] - 1) + (ulong)(local_c0[0] == 1);
                }
                else {
                  uVar22 = local_c0[lVar11] + (ulong)(local_c0[lVar11] == 0);
                  if (lVar11 == 1) goto LAB_001670d0;
                }
                local_c0[2] = local_c0[1];
LAB_001670d0:
                local_c0[1] = local_c0[0];
                goto LAB_00166b77;
              }
              uVar22 = local_c0[1];
              if (uVar21 == 0) goto LAB_001670d0;
            }
            else {
              if (0x1f < bVar5) {
                __assert_fail("ofBits <= MaxOff",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x6407,
                              "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e, const ZSTD_prefetch_e)"
                             );
              }
              local_118.bitsConsumed = local_118.bitsConsumed + bVar5;
              uVar22 = ((local_118.bitContainer << (bVar12 & 0x3f)) >> (-bVar5 & 0x3f)) +
                       (ulong)local_e0.table[local_e0.state].baseValue;
              local_c0[1] = local_c0[0];
              local_c0[2] = uVar9;
LAB_00166b77:
              local_c0[1] = local_c0[0];
              local_c0[0] = uVar22;
            }
            uVar9 = local_c0[0];
            if (bVar13 != 0) {
              bVar12 = (byte)local_118.bitsConsumed;
              local_118.bitsConsumed = local_118.bitsConsumed + bVar13;
              __n = __n + ((local_118.bitContainer << (bVar12 & 0x3f)) >> (-bVar13 & 0x3f));
            }
            if (0x1e < (byte)(bVar13 + bVar2 + bVar5)) {
              local_78 = op;
              BIT_reloadDStream(&local_118);
              op = local_78;
            }
            if (bVar2 != 0) {
              bVar13 = (byte)local_118.bitsConsumed;
              local_118.bitsConsumed = local_118.bitsConsumed + bVar2;
              uVar21 = uVar21 + ((local_118.bitContainer << (bVar13 & 0x3f)) >> (-bVar2 & 0x3f));
            }
            if (0x1f < bVar3) {
LAB_001671d7:
              __assert_fail("nbBits < BIT_MASK_SIZE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x65d,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
            }
            local_f0.state =
                 (ulong)((uint)(local_118.bitContainer >>
                               (-(char)(bVar3 + local_118.bitsConsumed) & 0x3fU)) & BIT_mask[bVar3])
                 + (ulong)uVar7;
            if (0x1f < bVar4) goto LAB_001671d7;
            iVar18 = bVar3 + local_118.bitsConsumed + (uint)bVar4;
            local_d0.state =
                 ((uint)(local_118.bitContainer >> (-(char)iVar18 & 0x3fU)) & BIT_mask[(uint)bVar4])
                 + local_58;
            if (0x1f < bVar6) goto LAB_001671d7;
            local_118.bitsConsumed = iVar18 + (uint)bVar6;
            local_e0.state =
                 ((uint)(local_118.bitContainer >> (-(char)local_118.bitsConsumed & 0x3fU)) &
                 BIT_mask[(uint)bVar6]) + local_60;
            uVar22 = uVar21 + __n;
            if ((long)uVar22 <= (long)uVar21) {
              __assert_fail("oLitEnd < oMatchEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x6386,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            pBVar14 = local_120 + uVar21;
            if ((pBVar19 < pBVar14) || (pBVar1 = op + uVar22, local_68 < pBVar1)) {
              sequence.matchLength = __n;
              sequence.litLength = uVar21;
              sequence.offset = uVar9;
              sequence.match = pBStack_38;
              local_50 = uVar21;
              sStack_48 = __n;
              uStack_40 = uVar9;
              uVar22 = ZSTD_execSequenceEnd
                                 (op,oend,sequence,&local_120,pBVar19,prefixStart,local_80,local_88)
              ;
            }
            else {
              __dest = op + uVar21;
              if (local_68 < __dest) {
                __assert_fail("oLitEnd <= oend_w",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x638c,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              uVar8 = *(undefined8 *)(local_120 + 8);
              *(undefined8 *)op = *(undefined8 *)local_120;
              *(undefined8 *)(op + 8) = uVar8;
              if (0x10 < uVar21) {
                ZSTD_decompressSequences();
              }
              pBVar17 = __dest + -uVar9;
              local_120 = pBVar14;
              if ((ulong)((long)__dest - (long)prefixStart) < uVar9) {
                if ((ulong)((long)__dest - (long)local_80) < uVar9) {
                  uVar22 = 0xffffffffffffffec;
                }
                else {
                  lVar11 = (long)(__dest + -uVar9) - (long)prefixStart;
                  pBVar14 = local_88 + lVar11;
                  if (local_88 < pBVar14 + __n) {
                    memmove(__dest,pBVar14,-lVar11);
                    __dest = __dest + -lVar11;
                    __n = __n + lVar11;
                    pBVar17 = prefixStart;
                    goto LAB_00166d5a;
                  }
                  memmove(__dest,pBVar14,__n);
                }
              }
              else {
LAB_00166d5a:
                if (pBVar1 < __dest) {
                  __assert_fail("op <= oMatchEnd",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x63ac,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if (pBVar17 < prefixStart) {
                  __assert_fail("match >= prefixStart",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x63ae,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if (__n == 0) {
                  __assert_fail("sequence.matchLength >= 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x63af,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if (uVar9 < 0x10) {
                  if (__dest < pBVar17) {
                    __assert_fail("*ip <= *op",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x6301,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
                  }
                  if (uVar9 < 8) {
                    iVar18 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                      ::dec64table + uVar9 * 4);
                    *__dest = *pBVar17;
                    __dest[1] = pBVar17[1];
                    __dest[2] = pBVar17[2];
                    __dest[3] = pBVar17[3];
                    pBVar14 = pBVar17 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar9 * 4);
                    pBVar17 = pBVar17 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar9 * 4) - (long)iVar18);
                    *(undefined4 *)(__dest + 4) = *(undefined4 *)pBVar14;
                  }
                  else {
                    *(undefined8 *)__dest = *(undefined8 *)pBVar17;
                  }
                  pBVar14 = pBVar17 + 8;
                  pBVar16 = __dest + 8;
                  if ((long)pBVar16 - (long)pBVar14 < 8) {
                    __assert_fail("*op - *ip >= 8",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x6313,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
                  }
                  if (8 < __n) {
                    if (pBVar1 <= pBVar16) {
                      __assert_fail("op < oMatchEnd",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x63c3,
                                    "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                                   );
                    }
                    if ((ulong)((long)pBVar16 - (long)pBVar14) < 0x10) {
                      do {
                        *(undefined8 *)pBVar16 = *(undefined8 *)pBVar14;
                        pBVar16 = pBVar16 + 8;
                        pBVar14 = pBVar14 + 8;
                      } while (pBVar16 < __dest + __n);
                    }
                    else {
                      uVar8 = *(undefined8 *)(pBVar17 + 0x10);
                      *(undefined8 *)pBVar16 = *(undefined8 *)pBVar14;
                      *(undefined8 *)(__dest + 0x10) = uVar8;
                      if (0x18 < (long)__n) {
                        lVar11 = 0;
                        do {
                          uVar8 = *(undefined8 *)(pBVar17 + lVar11 + 0x18 + 8);
                          pBVar14 = __dest + lVar11 + 0x18;
                          *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar17 + lVar11 + 0x18);
                          *(undefined8 *)(pBVar14 + 8) = uVar8;
                          uVar8 = *(undefined8 *)(pBVar17 + lVar11 + 0x28 + 8);
                          *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar17 + lVar11 + 0x28)
                          ;
                          *(undefined8 *)(pBVar14 + 0x18) = uVar8;
                          lVar11 = lVar11 + 0x20;
                        } while (pBVar14 + 0x20 < __dest + __n);
                      }
                    }
                  }
                }
                else {
                  lVar11 = (long)__dest - (long)pBVar17;
                  if (lVar11 < 8) {
                    if (-0x10 < lVar11) {
                      __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x1268,
                                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                   );
                    }
                  }
                  else if (0xffffffffffffffe0 < lVar11 - 0x10U) {
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1270,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  uVar8 = *(undefined8 *)(pBVar17 + 8);
                  *(undefined8 *)__dest = *(undefined8 *)pBVar17;
                  *(undefined8 *)(__dest + 8) = uVar8;
                  if (0x10 < (long)__n) {
                    lVar11 = 0x10;
                    do {
                      uVar8 = *(undefined8 *)(pBVar17 + lVar11 + 8);
                      pBVar14 = __dest + lVar11;
                      *(undefined8 *)pBVar14 = *(undefined8 *)(pBVar17 + lVar11);
                      *(undefined8 *)(pBVar14 + 8) = uVar8;
                      uVar8 = *(undefined8 *)(pBVar17 + lVar11 + 0x10 + 8);
                      *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(pBVar17 + lVar11 + 0x10);
                      *(undefined8 *)(pBVar14 + 0x18) = uVar8;
                      lVar11 = lVar11 + 0x20;
                    } while (pBVar14 + 0x20 < __dest + __n);
                  }
                }
              }
            }
            if (local_118.bitsConsumed < 0x41) {
              if (local_118.ptr < local_118.limitPtr) {
                if (local_118.ptr == local_118.start) goto LAB_00166e99;
                uVar15 = (int)local_118.ptr - (int)local_118.start;
                if (local_118.start <=
                    (ulong *)((long)local_118.ptr - (ulong)(local_118.bitsConsumed >> 3))) {
                  uVar15 = local_118.bitsConsumed >> 3;
                }
                local_118.bitsConsumed = local_118.bitsConsumed + uVar15 * -8;
              }
              else {
                uVar15 = local_118.bitsConsumed >> 3;
                local_118.bitsConsumed = local_118.bitsConsumed & 7;
              }
              local_118.ptr = (char *)((long)local_118.ptr - (ulong)uVar15);
              local_118.bitContainer = *(size_t *)local_118.ptr;
            }
LAB_00166e99:
            if (0xffffffffffffff88 < uVar22) {
              uVar20 = uVar22;
              uVar22 = 0;
            }
            op = op + uVar22;
            nbSeq = nbSeq + -1;
          } while (nbSeq != 0);
          if (0xffffffffffffff88 < uVar20) {
            return uVar20;
          }
          if (local_118.bitsConsumed < 0x41) {
            if ((local_118.bitsConsumed != 0x40) || (local_118.limitPtr <= local_118.ptr))
            goto LAB_001671bb;
            if (local_118.ptr != local_118.start) {
              return 0xffffffffffffffec;
            }
          }
          lVar11 = 0;
          do {
            (local_70->entropy).rep[lVar11] = (U32)local_c0[lVar11];
            lVar11 = lVar11 + 1;
            dst = local_90;
          } while (lVar11 != 3);
          goto LAB_0016718d;
        }
      }
      else {
        local_118.ptr = (char *)((long)seqStart + (seqSize - 8));
        local_118.bitContainer = *(size_t *)local_118.ptr;
        if (local_118.bitContainer >> 0x38 != 0) {
          uVar15 = 0x1f;
          bVar2 = (byte)(local_118.bitContainer >> 0x38);
          if (bVar2 != 0) {
            for (; bVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
            }
          }
          local_118.bitsConsumed = ~uVar15 + 9;
          if (seqSize < 0xffffffffffffff89) goto LAB_00166a11;
        }
      }
    }
LAB_001671bb:
    pBVar19 = (BYTE *)0xffffffffffffffec;
  }
  return (size_t)pBVar19;
}

Assistant:

static size_t
ZSTD_decompressSequences(ZSTD_DCtx* dctx, void* dst, size_t maxDstSize,
                   const void* seqStart, size_t seqSize, int nbSeq,
                   const ZSTD_longOffset_e isLongOffset)
{
    DEBUGLOG(5, "ZSTD_decompressSequences");
#if DYNAMIC_BMI2
    if (dctx->bmi2) {
        return ZSTD_decompressSequences_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
    }
#endif
  return ZSTD_decompressSequences_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}